

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O3

DdNode * cuddAddNonSimComposeRecur
                   (DdManager *dd,DdNode *f,DdNode **vector,DdNode *key,DdNode *cube,int lastsub)

{
  int *piVar1;
  uint i;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode **vector_00;
  DdNode **vector_01;
  DdNode *pDVar5;
  DdNode *pDVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  DdNode *local_68;
  DdNode *local_58;
  DdNode *local_48;
  
  if (dd->one == cube) {
    return f;
  }
  if (f->index == 0x7fffffff) {
    return f;
  }
  pDVar4 = cuddCacheLookup(dd,0x46,f,key,cube);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  uVar3 = 0x7fffffff;
  uVar7 = 0x7fffffff;
  if ((ulong)f->index != 0x7fffffff) {
    uVar7 = dd->perm[f->index];
  }
  if ((ulong)key->index != 0x7fffffff) {
    uVar3 = dd->perm[key->index];
  }
  uVar8 = uVar7;
  if (uVar3 < uVar7) {
    uVar8 = uVar3;
  }
  uVar10 = 0x7fffffff;
  if ((ulong)cube->index != 0x7fffffff) {
    uVar10 = dd->perm[cube->index];
  }
  uVar2 = uVar8;
  if (uVar10 < uVar8) {
    uVar2 = uVar10;
  }
  i = dd->invperm[uVar2];
  pDVar5 = f;
  pDVar4 = f;
  if (uVar7 == uVar2) {
    pDVar4 = (f->type).kids.T;
    pDVar5 = (f->type).kids.E;
  }
  if (uVar8 < uVar10) {
    local_68 = key;
    local_48 = key;
    if (uVar3 == uVar2) {
      local_68 = (key->type).kids.T;
      local_48 = (key->type).kids.E;
    }
    piVar1 = (int *)(((ulong)local_68 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    local_58 = cube;
  }
  else {
    local_58 = (cube->type).kids.T;
    local_68 = Cudd_addIthVar(dd,i);
    if (local_68 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    piVar1 = (int *)(((ulong)local_68 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    local_48 = cuddAddExistAbstractRecur(dd,key,local_68);
    if (local_48 == (DdNode *)0x0) goto LAB_00809cff;
    piVar1 = (int *)(((ulong)local_48 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,local_68);
    local_68 = local_48;
  }
  vector_00 = (DdNode **)malloc((long)lastsub << 3);
  if (vector_00 == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
LAB_00809cff:
    Cudd_RecursiveDeref(dd,local_68);
    return (DdNode *)0x0;
  }
  vector_01 = (DdNode **)malloc((long)lastsub << 3);
  if (vector_01 == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    Cudd_RecursiveDeref(dd,local_68);
  }
  else {
    if (0 < lastsub) {
      uVar9 = 0;
      do {
        pDVar6 = vector[uVar9];
        if (pDVar6 == (DdNode *)0x0) {
          vector_01[uVar9] = (DdNode *)0x0;
          vector_00[uVar9] = (DdNode *)0x0;
        }
        else if (pDVar6->index == i) {
          vector_00[uVar9] = (DdNode *)(pDVar6->type).value;
          vector_01[uVar9] = (pDVar6->type).kids.E;
        }
        else {
          vector_01[uVar9] = pDVar6;
          vector_00[uVar9] = pDVar6;
        }
        uVar9 = uVar9 + 1;
      } while ((uint)lastsub != uVar9);
    }
    vector_01[i] = (DdNode *)0x0;
    vector_00[i] = (DdNode *)0x0;
    pDVar4 = cuddAddNonSimComposeRecur(dd,pDVar4,vector_00,local_68,local_58,lastsub);
    free(vector_00);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar5 = cuddAddNonSimComposeRecur(dd,pDVar5,vector_01,local_48,local_58,lastsub);
      free(vector_01);
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,local_68);
        local_68 = pDVar4;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,local_68);
        pDVar6 = cuddAddIteRecur(dd,vector[i],pDVar4,pDVar5);
        if (pDVar6 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar4);
          Cudd_RecursiveDeref(dd,pDVar5);
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert(dd,0x46,f,key,cube,pDVar6);
          return pDVar6;
        }
        Cudd_RecursiveDeref(dd,pDVar4);
        local_68 = pDVar5;
      }
      goto LAB_00809cff;
    }
    Cudd_RecursiveDeref(dd,local_68);
    vector_00 = vector_01;
  }
  free(vector_00);
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
cuddAddNonSimComposeRecur(
  DdManager * dd,
  DdNode * f,
  DdNode ** vector,
  DdNode * key,
  DdNode * cube,
  int  lastsub)
{
    DdNode *f1, *f0, *key1, *key0, *cube1, *var;
    DdNode *T,*E;
    DdNode *r;
    unsigned int top, topf, topk, topc;
    unsigned int index;
    int i;
    DdNode **vect1;
    DdNode **vect0;

    statLine(dd);
    /* If we are past the deepest substitution, return f. */
    if (cube == DD_ONE(dd) || cuddIsConstant(f)) {
        return(f);
    }

    /* If problem already solved, look up answer and return. */
    r = cuddCacheLookup(dd,DD_ADD_NON_SIM_COMPOSE_TAG,f,key,cube);
    if (r != NULL) {
        return(r);
    }

    /* Find top variable. we just need to look at f, key, and cube,
    ** because all the varibles in the gi are in key.
    */
    topf = cuddI(dd,f->index);
    topk = cuddI(dd,key->index);
    top = ddMin(topf,topk);
    topc = cuddI(dd,cube->index);
    top = ddMin(top,topc);
    index = dd->invperm[top];

    /* Compute the cofactors. */
    if (topf == top) {
        f1 = cuddT(f);
        f0 = cuddE(f);
    } else {
        f1 = f0 = f;
    }
    if (topc == top) {
        cube1 = cuddT(cube);
        /* We want to eliminate vector[index] from key. Otherwise
        ** cache performance is severely affected. Hence we
        ** existentially quantify the variable with index "index" from key.
        */
        var = Cudd_addIthVar(dd, (int) index);
        if (var == NULL) {
            return(NULL);
        }
        cuddRef(var);
        key1 = cuddAddExistAbstractRecur(dd, key, var);
        if (key1 == NULL) {
            Cudd_RecursiveDeref(dd,var);
            return(NULL);
        }
        cuddRef(key1);
        Cudd_RecursiveDeref(dd,var);
        key0 = key1;
    } else {
        cube1 = cube;
        if (topk == top) {
            key1 = cuddT(key);
            key0 = cuddE(key);
        } else {
            key1 = key0 = key;
        }
        cuddRef(key1);
    }

    /* Allocate two new vectors for the cofactors of vector. */
    vect1 = ABC_ALLOC(DdNode *,lastsub);
    if (vect1 == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd,key1);
        return(NULL);
    }
    vect0 = ABC_ALLOC(DdNode *,lastsub);
    if (vect0 == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd,key1);
        ABC_FREE(vect1);
        return(NULL);
    }

    /* Cofactor the gi. Eliminate vect1[index] and vect0[index], because
    ** we do not need them.
    */
    for (i = 0; i < lastsub; i++) {
        DdNode *gi = vector[i];
        if (gi == NULL) {
            vect1[i] = vect0[i] = NULL;
        } else if (gi->index == index) {
            vect1[i] = cuddT(gi);
            vect0[i] = cuddE(gi);
        } else {
            vect1[i] = vect0[i] = gi;
        }
    }
    vect1[index] = vect0[index] = NULL;

    /* Recur on children. */
    T = cuddAddNonSimComposeRecur(dd,f1,vect1,key1,cube1,lastsub);
    ABC_FREE(vect1);
    if (T == NULL) {
        Cudd_RecursiveDeref(dd,key1);
        ABC_FREE(vect0);
        return(NULL);
    }
    cuddRef(T);
    E = cuddAddNonSimComposeRecur(dd,f0,vect0,key0,cube1,lastsub);
    ABC_FREE(vect0);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd,key1);
        Cudd_RecursiveDeref(dd,T);
        return(NULL);
    }
    cuddRef(E);
    Cudd_RecursiveDeref(dd,key1);

    /* Retrieve the 0-1 ADD for the current top variable from vector,
    ** and call cuddAddIteRecur with the T and E we just created.
    */
    r = cuddAddIteRecur(dd,vector[index],T,E);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd,T);
        Cudd_RecursiveDeref(dd,E);
        return(NULL);
    }
    cuddRef(r);
    Cudd_RecursiveDeref(dd,T);
    Cudd_RecursiveDeref(dd,E);
    cuddDeref(r);

    /* Store answer to trim recursion. */
    cuddCacheInsert(dd,DD_ADD_NON_SIM_COMPOSE_TAG,f,key,cube,r);

    return(r);

}